

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

bool __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToNextExecutionMode
          (FunctionExecutionStateMachine *this)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode executionMode;
  uint sourceContextId;
  undefined4 *puVar4;
  uint16 *puVar5;
  FunctionEntryPointInfo *pFVar6;
  undefined **this_00;
  char *pcVar7;
  Type state;
  FunctionExecutionStateMachine *local_40;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x21c,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) goto LAB_0078bd4c;
    *puVar4 = 0;
  }
  if (this->executionState != FullJit) {
    puVar5 = GetStateLimit(this,this->executionState);
    pFVar6 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
    if (((this->executionState == SimpleJit) || ((uint)*puVar5 <= this->interpretedCount)) &&
       ((pFVar6 == (FunctionEntryPointInfo *)0x0 || (pFVar6->callsCount == 0)))) {
      CommitExecutedIterations(this,puVar5,(uint)*puVar5);
      this->interpretedCount = 0;
      state = this->executionState;
      this_00 = &PTR_0155fe48;
      puVar4 = (undefined4 *)__tls_get_addr();
      bVar3 = state == FullJit;
      if (!bVar3) {
        local_40 = (FunctionExecutionStateMachine *)&DAT_015bbe90;
        do {
          this_00 = (undefined **)this;
          puVar5 = GetStateLimit(this,state);
          if (*puVar5 != 0) {
            if ((!bVar3) &&
               (this_00 = (undefined **)this, puVar5 = GetStateLimit(this,state), *puVar5 == 0)) {
              return false;
            }
            break;
          }
          bVar3 = state == Interpreter;
          state = state + AutoProfilingInterpreter0;
          if (bVar3) {
            state = FullJit;
          }
          if (state == FullJit) {
            sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)(this->owner).ptr);
            pFVar1 = (this->owner).ptr;
            if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
                (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar4 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar3) goto LAB_0078bd4c;
              *puVar4 = 0;
            }
            this_00 = (undefined **)local_40;
            bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FullJitPhase,sourceContextId,
                                      ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.
                                       functionInfo.ptr)->functionId);
            if (bVar3) {
              return false;
            }
          }
          bVar3 = state == FullJit;
        } while (!bVar3);
      }
      if (state == this->executionState) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        pcVar7 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
        ;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                    ,0x25e,"(newState != executionState)",
                                    "newState != executionState");
        if (!bVar3) {
LAB_0078bd4c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        this_00 = (undefined **)pcVar7;
      }
      executionMode = StateToMode((FunctionExecutionStateMachine *)this_00,state);
      VerifyExecutionMode(this,executionMode);
      this->executionState = state;
      return true;
    }
  }
  return false;
}

Assistant:

bool FunctionExecutionStateMachine::TryTransitionToNextExecutionMode()
    {
        Assert(initializedExecutionModeAndLimits);

        bool isStateChanged = false;
        if (executionState != ExecutionState::FullJit)
        {
            bool isTransitionNeeded;
            uint16& stateLimit = GetStateLimit(executionState);
            FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();

            // Determine if the current state should not transition when
            // - for non-JITed states, the interpreted count is less than the limit
            // - for JITed states (specifically, SimpleJIT because it can transition), the callsCount
            //   is non-zero. CallsCount starts at the limit and decrements to 0 to indicate transition.
            if ((executionState != ExecutionState::SimpleJit && GetInterpretedCount() < stateLimit)
                || (simpleJitEntryPointInfo != nullptr && simpleJitEntryPointInfo->callsCount > 0))
            {
                // Since the current state is under its limit, no transition is needed.
                // Simply verify the current state's execution mode before returning.
                isTransitionNeeded = false;
            }
            else
            {
                // Since the current state's limit is reached, transition from this state to the next state
                // First, save data from the current state
                CommitExecutedIterations(stateLimit, stateLimit);

                // Then, reset data for the next state
                SetInterpretedCount(0);

                isTransitionNeeded = true;
            }

            if (isTransitionNeeded)
            {
                // Keep advancing the state until a terminal state is found or until there are no more 
                // states to reach. The path of advancement is described in the banner comment above.
                ExecutionState newState = executionState;
                while (isTransitionNeeded && !IsTerminalState(newState))
                {
                    if (newState != ExecutionState::Interpreter)
                    {
                        // Most states simply advance to the next state
                        newState = static_cast<ExecutionState>(static_cast<uint8>(newState) + 1);
                    }
                    else
                    {
                        // Interpreter advances straight to FullJit
                        newState = ExecutionState::FullJit;
                    }

                    // If FullJit is the next state, but FullJit is disabled, then no transition
                    // is needed.
                    if (newState == ExecutionState::FullJit && PHASE_OFF(FullJitPhase, owner))
                    {
                        isTransitionNeeded = false;
                    }
                    else
                    {
                        // Otherwise, transition is needed because there is new state available
                        isTransitionNeeded = true;
                    }
                }

                // Only update the execution state when the new state is a terminal state
                if (isTransitionNeeded && IsTerminalState(newState))
                {
                    Assert(newState != executionState);
                    SetExecutionState(newState);
                    isStateChanged = true;
                }
            }
        }

        return isStateChanged;
    }